

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::Subject::Subject(Subject *this,string *formatted_string)

{
  Subject SStack_28;
  
  SubjectUtils::CreateSubjectFromString(&SStack_28,formatted_string);
  Subject(this,&SStack_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&SStack_28.components_);
  return;
}

Assistant:

Subject::Subject(const std::string& formatted_string) : Subject(SubjectUtils::CreateSubjectFromString(formatted_string))
{
}